

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalCreateSemaphore
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,LONG lInitialCount
                    ,LONG lMaximumCount,LPCWSTR lpName,HANDLE *phSemaphore)

{
  PAL_ERROR PVar1;
  char *__format;
  LPSECURITY_ATTRIBUTES p_Var2;
  undefined1 local_70 [8];
  CObjectAttributes oa;
  IPalObject *pobjRegisteredSemaphore;
  SemaphoreImmutableData *pSemaphoreData;
  ISynchStateController *pssc;
  IPalObject *pobjSemaphore;
  
  pobjSemaphore._4_4_ = lInitialCount;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_70,lpName,lpSemaphoreAttributes);
  pssc = (ISynchStateController *)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x117);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (phSemaphore == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x118);
    fprintf(_stderr,"Expression: NULL != phSemaphore\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013670b;
  if (lpName == (LPCWSTR)0x0) {
    if ((uint)lMaximumCount < pobjSemaphore._4_4_ || lMaximumCount < 1) {
      PVar1 = 0x57;
      p_Var2 = (LPSECURITY_ATTRIBUTES)pssc;
    }
    else {
      PVar1 = (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,&otSemaphore,local_70,&pssc);
      p_Var2 = (LPSECURITY_ATTRIBUTES)pssc;
      if (PVar1 == 0) {
        PVar1 = (*pssc->_vptr_ISynchStateController[2])(pssc,&pobjRegisteredSemaphore);
        if (PVar1 == 0) {
          *(LONG *)&pobjRegisteredSemaphore->_vptr_IPalObject = lMaximumCount;
          if (pobjSemaphore._4_4_ == 0) {
LAB_001366cf:
            PVar1 = (**(code **)(*g_pObjectManager + 8))
                              (g_pObjectManager,pthr,pssc,&aotSempahore,0,phSemaphore,
                               &oa.pSecurityAttributes);
            pssc = (ISynchStateController *)0x0;
            p_Var2 = oa.pSecurityAttributes;
            goto LAB_0013659b;
          }
          PVar1 = (*pssc->_vptr_ISynchStateController[5])(pssc,pthr,&pSemaphoreData);
          if (PVar1 == 0) {
            PVar1 = (**(code **)(*(long *)pSemaphoreData + 8))(pSemaphoreData,pobjSemaphore._4_4_);
            (**(code **)(*(long *)pSemaphoreData + 0x30))();
            if (PVar1 == 0) goto LAB_001366cf;
          }
          fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x160);
          __format = "Unable to set new semaphore state (%d)\n";
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x149);
          __format = "Error %d obtaining object data\n";
        }
        fprintf(_stderr,__format,(ulong)PVar1);
        p_Var2 = (LPSECURITY_ATTRIBUTES)pssc;
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x126);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    PVar1 = 0x32;
    p_Var2 = (LPSECURITY_ATTRIBUTES)pssc;
  }
LAB_0013659b:
  if (p_Var2 != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)p_Var2 + 0x40))(p_Var2,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar1;
  }
LAB_0013670b:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateSemaphore(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,
    LONG lInitialCount,
    LONG lMaximumCount,
    LPCWSTR lpName,
    HANDLE *phSemaphore
    )
{
    CObjectAttributes oa(lpName, lpSemaphoreAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSemaphore = NULL;
    IPalObject *pobjRegisteredSemaphore = NULL;
    SemaphoreImmutableData *pSemaphoreData;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phSemaphore);

    ENTRY("InternalCreateSemaphore(pthr=%p, lpSemaphoreAttributes=%p, "
        "lInitialCount=%d, lMaximumCount=%d, lpName=%p, phSemaphore=%p)\n",
        pthr,
        lpSemaphoreAttributes,
        lInitialCount,
        lMaximumCount,
        lpName,
        phSemaphore
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateSemaphoreExit;
    }

    if (lMaximumCount <= 0)
    {
        ERROR("lMaximumCount is invalid (%d)\n", lMaximumCount);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateSemaphoreExit;
    }

    if ((lInitialCount < 0) || (lInitialCount > lMaximumCount))
    {
        ERROR("lInitialCount is invalid (%d)\n", lInitialCount);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateSemaphoreExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        &otSemaphore,
        &oa,
        &pobjSemaphore
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateSemaphoreExit;
    }

    palError = pobjSemaphore->GetImmutableData(reinterpret_cast<void**>(&pSemaphoreData));

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining object data\n", palError);
        goto InternalCreateSemaphoreExit;
    }

    pSemaphoreData->lMaximumCount = lMaximumCount;

    if (0 != lInitialCount)
    {
        ISynchStateController *pssc;

        palError = pobjSemaphore->GetSynchStateController(
            pthr,
            &pssc
            );

        if (NO_ERROR == palError)
        {
            palError = pssc->SetSignalCount(lInitialCount);
            pssc->ReleaseController();
        }

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to set new semaphore state (%d)\n", palError);
            goto InternalCreateSemaphoreExit;
        }
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjSemaphore,
        &aotSempahore,
        0, // Should be SEMAPHORE_ALL_ACCESS; currently ignored (no Win32 security)
        phSemaphore,
        &pobjRegisteredSemaphore
        );

    //
    // pobjSemaphore is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pobjSemaphore = NULL;

InternalCreateSemaphoreExit:

    if (NULL != pobjSemaphore)
    {
        pobjSemaphore->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredSemaphore)
    {
        pobjRegisteredSemaphore->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateSemaphore returns %d\n", palError);

    return palError;
}